

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIDisplayer.cpp
# Opt level: O2

UIDisplayer * UIDisplayer::getInstance(GLfloat width,GLfloat height)

{
  UIDisplayer *this;
  
  if (uiDisplayer == (UIDisplayer *)0x0) {
    this = (UIDisplayer *)operator_new(0x20);
    UIDisplayer(this,width,height);
    uiDisplayer = this;
  }
  return uiDisplayer;
}

Assistant:

UIDisplayer* UIDisplayer::getInstance(GLfloat width, GLfloat height) {
    if (uiDisplayer == nullptr) {
        uiDisplayer = new UIDisplayer(width, height);
    }
    return uiDisplayer;
}